

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshCacheItem * __thiscall ON_MeshCache::Internal_CreateItem(ON_MeshCache *this)

{
  ON_MeshCacheItem *this_00;
  void *p;
  ON_MeshCacheItem *item;
  ON_MeshCache *this_local;
  
  this_00 = (ON_MeshCacheItem *)onmalloc(0x28);
  memset(this_00,0,0x28);
  ON_MeshCacheItem::ON_MeshCacheItem(this_00);
  return this_00;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_CreateItem()
{
  // Items must come from the main memory pool to prevent
  // crashing when meshing operations are canceled.
  // Use placement operator new with main heap memory.
  ON_MeshCacheItem* item;
  void* p = onmalloc(sizeof(*item));
  item = new (p) ON_MeshCacheItem();
  return item;
}